

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string_view name,Symbol symbol)

{
  ctrl_t *pcVar1;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  *prVar2;
  long lVar3;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
  *this_00;
  undefined8 uVar4;
  uint uVar5;
  ushort uVar6;
  undefined1 auVar7 [16];
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  anon_union_8_1_a8a14541_for_iterator_2 aVar24;
  undefined8 uVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  anon_union_8_1_a8a14541_for_iterator_2 aVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  ctrl_t cVar42;
  bool bVar43;
  ushort uVar45;
  int iVar46;
  Symbol *key;
  char cVar44;
  anon_union_8_1_a8a14541_for_iterator_2 aVar47;
  size_t i;
  MixingHashState MVar48;
  slot_type *psVar49;
  undefined8 uVar50;
  size_t __n;
  Symbol *b;
  Symbol *b_00;
  Symbol *b_01;
  Symbol *b_02;
  size_t cap_1;
  ulong uVar51;
  ctrl_t *pcVar52;
  anon_union_8_1_a8a14541_for_iterator_2 aVar53;
  uint uVar54;
  Symbol *key_1;
  ulong uVar55;
  size_type __rlen;
  undefined4 uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  __m128i match;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  iterator iVar63;
  iterator iVar64;
  FindInfo FVar65;
  iterator *local_c0;
  Symbol local_b8;
  ctrl_t *local_b0;
  anon_union_8_1_a8a14541_for_iterator_2 local_a8;
  pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> local_a0;
  undefined8 local_88;
  ctrl_t cStack_80;
  ctrl_t cStack_7f;
  ctrl_t cStack_7e;
  ctrl_t cStack_7d;
  ctrl_t cStack_7c;
  ctrl_t cStack_7b;
  ctrl_t cStack_7a;
  ctrl_t cStack_79;
  undefined1 local_78 [16];
  size_t local_68;
  char *local_60;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  
  __n = name._M_len;
  local_b8.ptr_ = symbol.ptr_;
  local_68 = __n;
  local_60 = name._M_str;
  Symbol::parent_name_key(&local_a0,&local_b8);
  if ((local_a0.second._M_len == __n) &&
     ((__n == 0 || (iVar46 = bcmp(name._M_str,local_a0.second._M_str,__n), iVar46 == 0)))) {
    Symbol::parent_name_key(&local_a0,&local_b8);
    if (local_a0.first == parent) {
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,&local_b8);
      prVar2 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)(this->symbols_by_parent_).
                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_;
      if (prVar2 != (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)0x1) {
        uVar25 = local_88;
        if (prVar2 != (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       *)0x0) {
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::prefetch_heap_block(prVar2);
          Symbol::parent_name_key(&local_a0,&local_b8);
          aVar47 = (anon_union_8_1_a8a14541_for_iterator_2)
                   absl::lts_20240722::hash_internal::
                   HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
                   combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                             ((MixingHashState)
                              &absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                              &local_a0.first,&local_a0.second);
          prVar2 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    *)(this->symbols_by_parent_).
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      .settings_.
                      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                      .value.capacity_;
          if (((ulong)((long)&(prVar2->settings_).
                              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                              .value.capacity_ + 1U) & (ulong)prVar2) == 0) {
            pcVar52 = (this->symbols_by_parent_).
                      super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      .settings_.
                      super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                      .
                      super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                      .value.heap_or_soo_.heap.control;
            uVar55 = (ulong)aVar47.slot_ >> 7 ^ (ulong)pcVar52 >> 0xc;
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::control(prVar2);
            auVar57 = ZEXT216(CONCAT11(aVar47._0_1_,aVar47._0_1_) & 0x7f7f);
            auVar57 = pshuflw(auVar57,auVar57,0);
            uVar56 = auVar57._0_4_;
            auVar57._4_4_ = uVar56;
            auVar57._0_4_ = uVar56;
            auVar57._8_4_ = uVar56;
            auVar57._12_4_ = uVar56;
            local_c0 = (iterator *)0x0;
            local_a8 = aVar47;
LAB_001e1531:
            uVar55 = uVar55 & (ulong)prVar2;
            pcVar1 = pcVar52 + uVar55;
            auVar58[0] = -(auVar57[0] == *pcVar1);
            auVar58[1] = -(auVar57[1] == pcVar1[1]);
            auVar58[2] = -(auVar57[2] == pcVar1[2]);
            auVar58[3] = -(auVar57[3] == pcVar1[3]);
            auVar58[4] = -(auVar57[4] == pcVar1[4]);
            auVar58[5] = -(auVar57[5] == pcVar1[5]);
            auVar58[6] = -(auVar57[6] == pcVar1[6]);
            auVar58[7] = -(auVar57[7] == pcVar1[7]);
            auVar58[8] = -(auVar57[8] == pcVar1[8]);
            auVar58[9] = -(auVar57[9] == pcVar1[9]);
            auVar58[10] = -(auVar57[10] == pcVar1[10]);
            auVar58[0xb] = -(auVar57[0xb] == pcVar1[0xb]);
            auVar58[0xc] = -(auVar57[0xc] == pcVar1[0xc]);
            auVar58[0xd] = -(auVar57[0xd] == pcVar1[0xd]);
            auVar58[0xe] = -(auVar57[0xe] == pcVar1[0xe]);
            auVar58[0xf] = -(auVar57[0xf] == pcVar1[0xf]);
            uVar45 = (ushort)(SUB161(auVar58 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar58 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar58 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar58 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar58 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar58 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar58 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar58 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar58 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar58 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar58 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar58 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar58 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar58 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar58 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar58[0xf] >> 7) << 0xf;
            uVar54 = (uint)uVar45;
            cVar8 = *pcVar1;
            cVar9 = pcVar1[1];
            cVar10 = pcVar1[2];
            cVar11 = pcVar1[3];
            cVar12 = pcVar1[4];
            cVar13 = pcVar1[5];
            cVar14 = pcVar1[6];
            cVar15 = pcVar1[7];
            cVar26 = pcVar1[8];
            cVar27 = pcVar1[9];
            cVar28 = pcVar1[10];
            cVar29 = pcVar1[0xb];
            cVar30 = pcVar1[0xc];
            cVar31 = pcVar1[0xd];
            cVar32 = pcVar1[0xe];
            cVar33 = pcVar1[0xf];
            uVar25 = local_88;
            cVar16 = cStack_80;
            cVar17 = cStack_7f;
            cVar18 = cStack_7e;
            cVar19 = cStack_7d;
            cVar20 = cStack_7c;
            cVar21 = cStack_7b;
            cVar22 = cStack_7a;
            cVar23 = cStack_79;
            local_88 = *(undefined8 *)pcVar1;
            while (cStack_79 = cVar33, cStack_7a = cVar32, cStack_7b = cVar31, cStack_7c = cVar30,
                  cStack_7d = cVar29, cStack_7e = cVar28, cStack_7f = cVar27, cStack_80 = cVar26,
                  uVar45 != 0) {
              uVar5 = 0;
              if (uVar54 != 0) {
                for (; (uVar54 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              uVar51 = uVar5 + uVar55 & (ulong)prVar2;
              lVar3 = *(long *)((long)&(this->symbols_by_parent_).
                                       super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                       .settings_.
                                       super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                       .
                                       super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                       .value.heap_or_soo_ + 8);
              local_b0 = pcVar52;
              local_78 = auVar57;
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            *)(this->symbols_by_parent_).
                              super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                              .settings_.
                              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                              .
                              super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                              .value.capacity_);
              bVar43 = (anonymous_namespace)::SymbolByParentEq::operator()
                                 ((void *)(uVar51 * 8 + lVar3),&local_b8,b);
              if (bVar43) {
                absl::lts_20240722::container_internal::
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                               *)this,uVar51);
                return false;
              }
              uVar45 = (ushort)(uVar54 - 1) & (ushort)uVar54;
              uVar54 = CONCAT22((short)(uVar54 - 1 >> 0x10),uVar45);
              pcVar52 = local_b0;
              auVar57 = local_78;
              cVar8 = (ctrl_t)local_88;
              cVar9 = local_88._1_1_;
              cVar10 = local_88._2_1_;
              cVar11 = local_88._3_1_;
              cVar12 = local_88._4_1_;
              cVar13 = local_88._5_1_;
              cVar14 = local_88._6_1_;
              cVar15 = local_88._7_1_;
              cVar26 = cStack_80;
              cVar27 = cStack_7f;
              cVar28 = cStack_7e;
              cVar29 = cStack_7d;
              cVar30 = cStack_7c;
              cVar31 = cStack_7b;
              cVar32 = cStack_7a;
              cVar33 = cStack_79;
              uVar25 = local_88;
              cVar16 = cStack_80;
              cVar17 = cStack_7f;
              cVar18 = cStack_7e;
              cVar19 = cStack_7d;
              cVar20 = cStack_7c;
              cVar21 = cStack_7b;
              cVar22 = cStack_7a;
              cVar23 = cStack_79;
            }
            auVar61[0] = -(cVar8 == kEmpty);
            auVar61[1] = -(cVar9 == kEmpty);
            auVar61[2] = -(cVar10 == kEmpty);
            auVar61[3] = -(cVar11 == kEmpty);
            auVar61[4] = -(cVar12 == kEmpty);
            auVar61[5] = -(cVar13 == kEmpty);
            auVar61[6] = -(cVar14 == kEmpty);
            auVar61[7] = -(cVar15 == kEmpty);
            auVar61[8] = -(cStack_80 == kEmpty);
            auVar61[9] = -(cStack_7f == kEmpty);
            auVar61[10] = -(cStack_7e == kEmpty);
            auVar61[0xb] = -(cStack_7d == kEmpty);
            auVar61[0xc] = -(cStack_7c == kEmpty);
            auVar61[0xd] = -(cStack_7b == kEmpty);
            auVar61[0xe] = -(cStack_7a == kEmpty);
            auVar61[0xf] = -(cStack_79 == kEmpty);
            uVar45 = (ushort)(SUB161(auVar61 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar61 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar61 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar61 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar61 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar61 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar61 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar61 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar61 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar61 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar61 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar61 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar61 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar61 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar61 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar61[0xf] >> 7) << 0xf;
            this_00 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       *)(this->symbols_by_parent_).
                         super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                         .value.capacity_;
            local_88 = uVar25;
            cStack_80 = cVar16;
            cStack_7f = cVar17;
            cStack_7e = cVar18;
            cStack_7d = cVar19;
            cStack_7c = cVar20;
            cStack_7b = cVar21;
            cStack_7a = cVar22;
            cStack_79 = cVar23;
            if (uVar45 == 0) {
              if (this_00 !=
                  (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                   *)0x0) goto code_r0x001e15d6;
            }
            else if (this_00 !=
                     (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)0x0) {
              pcVar52 = (this->symbols_by_parent_).
                        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                        .settings_.
                        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                        .
                        super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                        .value.heap_or_soo_.heap.control;
              absl::lts_20240722::container_internal::
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
              ::control(this_00);
              aVar47 = local_a8;
              cVar44 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                                 ((ulong)this_00,(ulong)local_a8,pcVar52);
              if (cVar44 == '\0') {
                uVar54 = 0;
                if (uVar45 != 0) {
                  for (; (uVar45 >> uVar54 & 1) == 0; uVar54 = uVar54 + 1) {
                  }
                }
              }
              else {
                uVar6 = 0xf;
                if (uVar45 != 0) {
                  for (; uVar45 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                  }
                }
                uVar54 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
              }
              FVar65.offset = uVar54 + uVar55 & (ulong)prVar2;
              FVar65.probe_length = (size_t)local_c0;
              i = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                            ((CommonFields *)this,(ulong)aVar47,FVar65,
                             (PolicyFunctions *)
                             absl::lts_20240722::container_internal::
                             raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByParentHash,google::protobuf::(anonymous_namespace)::SymbolByParentEq,std::allocator<google::protobuf::Symbol>>
                             ::GetPolicyFunctions()::value);
              goto LAB_001e1729;
            }
            goto LAB_001e199a;
          }
LAB_001e19b9:
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x145,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        goto LAB_001e199a;
      }
      if ((this->symbols_by_parent_).
          super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
          size_ < 2) {
        absl::lts_20240722::container_internal::CommonFields::AssertInSooMode((CommonFields *)this);
        (this->symbols_by_parent_).
        super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_
             = 2;
        aVar47.slot_ = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                   *)this);
        iVar63.field_1.slot_ = aVar47.slot_;
        iVar63.ctrl_ = (ctrl_t *)&absl::lts_20240722::container_internal::kSooControl;
      }
      else {
        psVar49 = absl::lts_20240722::container_internal::
                  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                              *)this);
        bVar43 = (anonymous_namespace)::SymbolByParentEq::operator()(psVar49,&local_b8,b_00);
        if (bVar43) {
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
          ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                      *)this);
          return false;
        }
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::resize_impl(this,3);
        Symbol::parent_name_key(&local_a0,&local_b8);
        MVar48 = absl::lts_20240722::hash_internal::
                 HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
                 combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                           ((MixingHashState)
                            &absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                            &local_a0.first,&local_a0.second);
        i = absl::lts_20240722::container_internal::PrepareInsertAfterSoo
                      (MVar48.state_,8,(CommonFields *)this);
LAB_001e1729:
        iVar63 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                 ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this,i);
      }
      aVar53 = iVar63.field_1;
      local_c0 = (iterator *)iVar63.ctrl_;
      (aVar53.slot_)->ptr_ = local_b8.ptr_;
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::iterator::operator*(local_c0);
      aVar47 = aVar53;
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
      ::AssertHashEqConsistent<google::protobuf::Symbol>
                ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)this,aVar53.slot_);
      prVar2 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                *)(this->symbols_by_parent_).
                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_;
      uVar25 = local_88;
      if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                     *)0x1) {
        if (1 < (this->symbols_by_parent_).
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.size_) {
          psVar49 = absl::lts_20240722::container_internal::
                    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                *)this);
          bVar43 = (anonymous_namespace)::SymbolByParentEq::operator()(psVar49,aVar53.slot_,b_02);
          aVar47 = aVar53;
          uVar25 = local_88;
          if (bVar43) {
            aVar47.slot_ = absl::lts_20240722::container_internal::
                           raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                           ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                       *)this);
            iVar64.field_1.slot_ = aVar47.slot_;
            iVar64.ctrl_ = (ctrl_t *)&absl::lts_20240722::container_internal::kSooControl;
            goto LAB_001e193e;
          }
        }
      }
      else {
        if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       *)0x0) goto LAB_001e199a;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::prefetch_heap_block(prVar2);
        aVar47.slot_ = (slot_type *)&local_a0;
        Symbol::parent_name_key
                  ((pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   aVar47.slot_,aVar53.slot_);
        MVar48 = absl::lts_20240722::hash_internal::
                 HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>::
                 combine<void_const*,std::basic_string_view<char,std::char_traits<char>>>
                           ((MixingHashState)
                            &absl::lts_20240722::hash_internal::MixingHashState::kSeed,
                            (void **)aVar47.slot_,&local_a0.second);
        prVar2 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  *)(this->symbols_by_parent_).
                    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                    .settings_.
                    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_;
        if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       *)0x1) {
          __assert_fail("!is_soo()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xdb0,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                       );
        }
        uVar25 = local_88;
        if (prVar2 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       *)0x0) goto LAB_001e199a;
        if (((ulong)((long)&(prVar2->settings_).
                            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_ + 1U) & (ulong)prVar2) != 0) goto LAB_001e19b9;
        pcVar52 = (this->symbols_by_parent_).
                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        uVar55 = MVar48.state_ >> 7 ^ (ulong)pcVar52 >> 0xc;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
        ::control(prVar2);
        auVar57 = ZEXT216(CONCAT11((char)MVar48.state_,(char)MVar48.state_) & 0x7f7f);
        auVar57 = pshuflw(auVar57,auVar57,0);
        uVar56 = auVar57._0_4_;
        auVar60._4_4_ = uVar56;
        auVar60._0_4_ = uVar56;
        auVar60._8_4_ = uVar56;
        auVar60._12_4_ = uVar56;
        uVar50 = ~kSentinel;
        while( true ) {
          aVar53 = iVar63.field_1;
          local_c0 = (iterator *)iVar63.ctrl_;
          uVar55 = uVar55 & (ulong)prVar2;
          pcVar1 = pcVar52 + uVar55;
          auVar59[0] = -(auVar60[0] == *pcVar1);
          auVar59[1] = -(auVar60[1] == pcVar1[1]);
          auVar59[2] = -(auVar60[2] == pcVar1[2]);
          auVar59[3] = -(auVar60[3] == pcVar1[3]);
          auVar59[4] = -(auVar60[4] == pcVar1[4]);
          auVar59[5] = -(auVar60[5] == pcVar1[5]);
          auVar59[6] = -(auVar60[6] == pcVar1[6]);
          auVar59[7] = -(auVar60[7] == pcVar1[7]);
          auVar59[8] = -(auVar60[8] == pcVar1[8]);
          auVar59[9] = -(auVar60[9] == pcVar1[9]);
          auVar59[10] = -(auVar60[10] == pcVar1[10]);
          auVar59[0xb] = -(auVar60[0xb] == pcVar1[0xb]);
          auVar59[0xc] = -(auVar60[0xc] == pcVar1[0xc]);
          auVar59[0xd] = -(auVar60[0xd] == pcVar1[0xd]);
          auVar59[0xe] = -(auVar60[0xe] == pcVar1[0xe]);
          auVar59[0xf] = -(auVar60[0xf] == pcVar1[0xf]);
          uVar45 = (ushort)(SUB161(auVar59 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar59 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar59[0xf] >> 7) << 0xf;
          uVar54 = (uint)uVar45;
          aVar34 = aVar53;
          cVar26 = *pcVar1;
          cVar27 = pcVar1[1];
          cVar28 = pcVar1[2];
          cVar29 = pcVar1[3];
          cVar30 = pcVar1[4];
          cVar31 = pcVar1[5];
          cVar32 = pcVar1[6];
          cVar33 = pcVar1[7];
          cVar35 = pcVar1[8];
          cVar36 = pcVar1[9];
          cVar37 = pcVar1[10];
          cVar38 = pcVar1[0xb];
          cVar39 = pcVar1[0xc];
          cVar40 = pcVar1[0xd];
          cVar41 = pcVar1[0xe];
          cVar42 = pcVar1[0xf];
          aVar24 = local_a8;
          uVar25 = local_88;
          cVar8 = local_58;
          cVar9 = cStack_57;
          cVar10 = cStack_56;
          cVar11 = cStack_55;
          cVar12 = cStack_54;
          cVar13 = cStack_53;
          cVar14 = cStack_52;
          cVar15 = cStack_51;
          cVar16 = cStack_50;
          cVar17 = cStack_4f;
          cVar18 = cStack_4e;
          cVar19 = cStack_4d;
          cVar20 = cStack_4c;
          cVar21 = cStack_4b;
          cVar22 = cStack_4a;
          cVar23 = cStack_49;
          while (cStack_49 = cVar42, cStack_4a = cVar41, cStack_4b = cVar40, cStack_4c = cVar39,
                cStack_4d = cVar38, cStack_4e = cVar37, cStack_4f = cVar36, cStack_50 = cVar35,
                cStack_51 = cVar33, cStack_52 = cVar32, cStack_53 = cVar31, cStack_54 = cVar30,
                cStack_55 = cVar29, cStack_56 = cVar28, cStack_57 = cVar27, local_58 = cVar26,
                local_a8 = aVar34, local_88 = uVar50, uVar45 != 0) {
            uVar5 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            uVar51 = uVar5 + uVar55 & (ulong)prVar2;
            lVar3 = *(long *)((long)&(this->symbols_by_parent_).
                                     super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                     .settings_.
                                     super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                                     .
                                     super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                                     .value.heap_or_soo_ + 8);
            local_b0 = pcVar52;
            local_78 = auVar60;
            absl::lts_20240722::container_internal::
            raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
            ::slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                          *)(this->symbols_by_parent_).
                            super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                            .settings_.
                            super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                            .
                            super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                            .value.capacity_);
            aVar53 = local_a8;
            aVar47 = local_a8;
            bVar43 = (anonymous_namespace)::SymbolByParentEq::operator()
                               ((void *)(uVar51 * 8 + lVar3),local_a8.slot_,b_01);
            if (bVar43) {
              iVar64 = absl::lts_20240722::container_internal::
                       raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                       ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                                      *)this,uVar51);
              goto LAB_001e193e;
            }
            uVar45 = (ushort)(uVar54 - 1) & (ushort)uVar54;
            uVar54 = CONCAT22((short)(uVar54 - 1 >> 0x10),uVar45);
            uVar50 = local_88;
            pcVar52 = local_b0;
            aVar34 = local_a8;
            auVar60 = local_78;
            cVar26 = local_58;
            cVar27 = cStack_57;
            cVar28 = cStack_56;
            cVar29 = cStack_55;
            cVar30 = cStack_54;
            cVar31 = cStack_53;
            cVar32 = cStack_52;
            cVar33 = cStack_51;
            cVar35 = cStack_50;
            cVar36 = cStack_4f;
            cVar37 = cStack_4e;
            cVar38 = cStack_4d;
            cVar39 = cStack_4c;
            cVar40 = cStack_4b;
            cVar41 = cStack_4a;
            cVar42 = cStack_49;
            aVar24 = local_a8;
            uVar25 = local_88;
            cVar8 = local_58;
            cVar9 = cStack_57;
            cVar10 = cStack_56;
            cVar11 = cStack_55;
            cVar12 = cStack_54;
            cVar13 = cStack_53;
            cVar14 = cStack_52;
            cVar15 = cStack_51;
            cVar16 = cStack_50;
            cVar17 = cStack_4f;
            cVar18 = cStack_4e;
            cVar19 = cStack_4d;
            cVar20 = cStack_4c;
            cVar21 = cStack_4b;
            cVar22 = cStack_4a;
            cVar23 = cStack_49;
          }
          iVar63.field_1.slot_ = aVar53.slot_;
          iVar63.ctrl_ = (ctrl_t *)local_c0;
          auVar62[0] = -(local_58 == kEmpty);
          auVar62[1] = -(cStack_57 == kEmpty);
          auVar62[2] = -(cStack_56 == kEmpty);
          auVar62[3] = -(cStack_55 == kEmpty);
          auVar62[4] = -(cStack_54 == kEmpty);
          auVar62[5] = -(cStack_53 == kEmpty);
          auVar62[6] = -(cStack_52 == kEmpty);
          auVar62[7] = -(cStack_51 == kEmpty);
          auVar62[8] = -(cStack_50 == kEmpty);
          auVar62[9] = -(cStack_4f == kEmpty);
          auVar62[10] = -(cStack_4e == kEmpty);
          auVar62[0xb] = -(cStack_4d == kEmpty);
          auVar62[0xc] = -(cStack_4c == kEmpty);
          auVar62[0xd] = -(cStack_4b == kEmpty);
          auVar62[0xe] = -(cStack_4a == kEmpty);
          bVar43 = cStack_49 == kEmpty;
          auVar62[0xf] = -bVar43;
          local_a8 = aVar24;
          local_58 = cVar8;
          cStack_57 = cVar9;
          cStack_56 = cVar10;
          cStack_55 = cVar11;
          cStack_54 = cVar12;
          cStack_53 = cVar13;
          cStack_52 = cVar14;
          cStack_51 = cVar15;
          cStack_50 = cVar16;
          cStack_4f = cVar17;
          cStack_4e = cVar18;
          cStack_4d = cVar19;
          cStack_4c = cVar20;
          cStack_4b = cVar21;
          cStack_4a = cVar22;
          cStack_49 = cVar23;
          if ((((((((((((((((auVar62 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar62 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar62 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar62 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar62 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar62 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar62 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar62 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar62 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar62 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar62 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar62 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar43) break;
          uVar4 = (this->symbols_by_parent_).
                  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByParentHash,_google::protobuf::(anonymous_namespace)::SymbolByParentEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                  value.capacity_;
          if (uVar4 == ~kSentinel) goto LAB_001e199a;
          uVar55 = uVar55 + local_88 + 0x10;
          uVar50 = local_88 + 0x10;
          local_88 = uVar25;
          if ((ulong)uVar4 < (ulong)uVar50) {
            __assert_fail("seq.index() <= capacity() && \"full table!\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xdbd,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                         );
          }
        }
      }
      local_88 = uVar25;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = aVar47;
      iVar64 = (iterator)(auVar7 << 0x40);
LAB_001e193e:
      bVar43 = absl::lts_20240722::container_internal::operator==
                         ((const_iterator *)iVar64.ctrl_,(const_iterator *)iVar64.field_1.slot_);
      if (!bVar43) {
        __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf3f,
                      "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                     );
      }
      return true;
    }
  }
  else {
    AddAliasUnderParent();
  }
  AddAliasUnderParent();
  uVar25 = local_88;
LAB_001e199a:
  local_88 = uVar25;
  __assert_fail("!kEnabled || cap >= kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb37,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>]"
               );
code_r0x001e15d6:
  uVar55 = (long)local_c0 + uVar55 + 0x10;
  local_c0 = local_c0 + 1;
  if (this_00 < local_c0) {
    __assert_fail("seq.index() <= capacity() && \"full table!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xef5,
                  "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByParentHash, google::protobuf::(anonymous namespace)::SymbolByParentEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByParentHash, Eq = google::protobuf::(anonymous namespace)::SymbolByParentEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                 );
  }
  goto LAB_001e1531;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(const void* parent,
                                               absl::string_view name,
                                               Symbol symbol) {
  ABSL_DCHECK_EQ(name, symbol.parent_name_key().second);
  ABSL_DCHECK_EQ(parent, symbol.parent_name_key().first);
  return symbols_by_parent_.insert(symbol).second;
}